

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

size_t __thiscall
Assimp::ColladaParser::ReadPrimitives
          (ColladaParser *this,Mesh *pMesh,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *pPerIndexChannels,size_t pNumPrimitives,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *pVCount,PrimitiveType pPrimType)

{
  pointer *ppuVar1;
  pointer pIVar2;
  pointer puVar3;
  size_t __n;
  iterator __position;
  bool bVar4;
  undefined8 uVar5;
  int iVar6;
  InputChannel *channel;
  pointer pIVar7;
  pointer puVar8;
  byte *pbVar9;
  ulong uVar10;
  Accessor *pAVar11;
  Data *pDVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  ulong numOffsets;
  size_t currentVertex;
  DataLibrary *pDVar17;
  IrrXMLReader *pIVar18;
  size_t sVar19;
  size_t perVertexOffset;
  ColladaParser *this_00;
  undefined4 in_register_0000008c;
  InputChannel *input;
  size_t numPoints;
  DataLibrary *local_98;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> *local_90;
  undefined1 local_88 [40];
  string local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_38;
  
  local_88._24_8_ = CONCAT44(in_register_0000008c,pPrimType);
  pIVar7 = (pPerIndexChannels->
           super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (pPerIndexChannels->
           super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar7 == pIVar2) {
    perVertexOffset = 0xffffffffffffffff;
    numOffsets = 1;
  }
  else {
    numOffsets = 1;
    perVertexOffset = 0xffffffffffffffff;
    do {
      uVar10 = pIVar7->mOffset + 1;
      if (uVar10 < numOffsets) {
        uVar10 = numOffsets;
      }
      numOffsets = uVar10;
      if (pIVar7->mType == IT_Vertex) {
        perVertexOffset = pIVar7->mOffset;
      }
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != pIVar2);
  }
  local_90 = pPerIndexChannels;
  __range2 = pVCount;
  if (pPrimType == Prim_Lines) {
    pDVar17 = (DataLibrary *)(pNumPrimitives * 2);
LAB_004295f6:
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (pointer)0x0;
    local_88._16_8_ = 0;
    if (pDVar17 == (DataLibrary *)0x0) goto LAB_00429626;
    this_00 = (ColladaParser *)local_88;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
               (long)pDVar17 * numOffsets);
    bVar4 = false;
    local_98 = pDVar17;
  }
  else {
    if (pPrimType == Prim_Triangles) {
      pDVar17 = (DataLibrary *)(pNumPrimitives * 3);
      goto LAB_004295f6;
    }
    if (pPrimType == Prim_Polylist) {
      puVar8 = (pVCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (pVCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar8 != puVar3) {
        pDVar17 = (DataLibrary *)0x0;
        do {
          pDVar17 = (DataLibrary *)(&(pDVar17->_M_t)._M_impl.field_0x0 + *puVar8);
          puVar8 = puVar8 + 1;
        } while (puVar8 != puVar3);
        goto LAB_004295f6;
      }
    }
LAB_00429626:
    local_88._16_8_ = 0;
    local_88._8_8_ = (pointer)0x0;
    local_88._0_8_ = (pointer)0x0;
    bVar4 = true;
    local_98 = (DataLibrary *)0x0;
    this_00 = this;
  }
  local_88._32_8_ = pNumPrimitives;
  if (pNumPrimitives != 0) {
    this_00 = this;
    pbVar9 = (byte *)GetTextContent(this);
    uVar10 = (ulong)*pbVar9;
    if (*pbVar9 != 0) {
      do {
        pbVar9 = pbVar9 + (((int)uVar10 - 0x2bU & 0xfd) == 0);
        bVar13 = *pbVar9;
        if ((byte)(bVar13 - 0x3a) < 0xf6) {
          uVar16 = 0;
        }
        else {
          uVar16 = 0;
          do {
            uVar16 = (uint)(byte)(bVar13 - 0x30) + uVar16 * 10;
            bVar13 = pbVar9[1];
            pbVar9 = pbVar9 + 1;
          } while (0xf5 < (byte)(bVar13 - 0x3a));
        }
        uVar14 = -uVar16;
        if ((char)uVar10 != '-') {
          uVar14 = uVar16;
        }
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        local_60._M_dataplus._M_p = (pointer)(ulong)uVar14;
        this_00 = (ColladaParser *)local_88;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                   (unsigned_long *)&local_60);
        for (; uVar10 = (ulong)*pbVar9, uVar10 < 0x21; pbVar9 = pbVar9 + 1) {
          if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
            if (uVar10 == 0) goto LAB_004296da;
            break;
          }
        }
      } while( true );
    }
  }
LAB_004296da:
  uVar10 = (long)(local_88._8_8_ - local_88._0_8_) >> 3;
  if (bVar4) {
    if (uVar10 % numOffsets != 0) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Expected different index count in <p> element.","");
      ThrowException(this,&local_60);
    }
  }
  else if (uVar10 != (long)local_98 * numOffsets) {
    if (local_88._24_4_ != 1) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Expected different index count in <p> element.","");
      ThrowException(this,&local_60);
    }
    ReportWarning(this_00,"Expected different index count in <p> element, %zu instead of %zu.",
                  uVar10);
    local_88._32_8_ = (ulong)((long)(local_88._8_8_ - local_88._0_8_) >> 3) / numOffsets >> 1;
  }
  pIVar7 = (pMesh->mPerVertexData).
           super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar7 != (pMesh->mPerVertexData).
                super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_98 = &this->mDataLibrary;
    do {
      if (pIVar7->mResolved == (Accessor *)0x0) {
        pAVar11 = ResolveLibraryReference<Assimp::Collada::Accessor>
                            (this,&this->mAccessorLibrary,&pIVar7->mAccessor);
        pIVar7->mResolved = pAVar11;
        if (pAVar11->mData == (Data *)0x0) {
          pDVar12 = ResolveLibraryReference<Assimp::Collada::Data>(this,local_98,&pAVar11->mSource);
          pAVar11->mData = pDVar12;
        }
      }
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != (pMesh->mPerVertexData).
                       super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pIVar7 = (local_90->
           super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pIVar7 != (local_90->
                super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_98 = &this->mDataLibrary;
    do {
      if (pIVar7->mResolved == (Accessor *)0x0) {
        if (pIVar7->mType == IT_Vertex) {
          __n = (pIVar7->mAccessor)._M_string_length;
          if ((__n != (pMesh->mVertexID)._M_string_length) ||
             ((__n != 0 &&
              (iVar6 = bcmp((pIVar7->mAccessor)._M_dataplus._M_p,(pMesh->mVertexID)._M_dataplus._M_p
                            ,__n), iVar6 != 0)))) {
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_60,"Unsupported vertex referencing scheme.","");
            ThrowException(this,&local_60);
          }
        }
        else {
          pAVar11 = ResolveLibraryReference<Assimp::Collada::Accessor>
                              (this,&this->mAccessorLibrary,&pIVar7->mAccessor);
          pIVar7->mResolved = pAVar11;
          if (pAVar11->mData == (Data *)0x0) {
            pDVar12 = ResolveLibraryReference<Assimp::Collada::Data>
                                (this,local_98,&pAVar11->mSource);
            pAVar11->mData = pDVar12;
          }
        }
      }
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != (local_90->
                       super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  uVar16 = (uint)local_88._24_8_;
  pIVar18 = (IrrXMLReader *)local_88._32_8_;
  if ((uVar16 & 0xfffffffd) == 5) {
    pIVar18 = (IrrXMLReader *)0x1;
  }
  if (uVar16 == 2) {
    lVar15 = -1;
  }
  else {
    lVar15 = -2;
    if (uVar16 != 4) goto LAB_004298c8;
  }
  pIVar18 = (IrrXMLReader *)
            ((ulong)((long)(local_88._8_8_ - local_88._0_8_) >> 3) / numOffsets + lVar15);
LAB_004298c8:
  local_38 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&pMesh->mFaceSize;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,(size_type)pIVar18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&pMesh->mFacePosIndices,
             (ulong)((long)(local_88._8_8_ - local_88._0_8_) >> 3) / numOffsets);
  local_88._32_8_ = pIVar18;
  if (pIVar18 != (IrrXMLReader *)0x0) {
    pIVar18 = (IrrXMLReader *)0x0;
    local_88._24_8_ = ZEXT48((int)local_88._24_8_ - 1);
    local_98 = (DataLibrary *)0x0;
    do {
      numPoints = 0;
      if (6 < (uint)local_88._24_8_) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Unsupported primitive type.","");
        ThrowException(this,&local_60);
      }
      switch((long)&switchD_0042994e::switchdataD_006c0c00 +
             (long)(int)(&switchD_0042994e::switchdataD_006c0c00)[local_88._24_8_]) {
      case 0x429950:
        uVar10 = (long)(local_88._8_8_ - local_88._0_8_) >> 3;
        numPoints = uVar10 / numOffsets;
        if (numOffsets <= uVar10) {
          sVar19 = 0;
          do {
            CopyVertex(this,sVar19,numOffsets,numPoints,perVertexOffset,pMesh,local_90,
                       (size_t)pIVar18,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
            sVar19 = sVar19 + 1;
          } while (sVar19 < numPoints);
        }
        break;
      case 0x4299b1:
        numPoints = 3;
        sVar19 = 0;
        do {
          CopyVertex(this,sVar19,numOffsets,numPoints,perVertexOffset,pMesh,local_90,(size_t)pIVar18
                     ,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
          sVar19 = sVar19 + 1;
        } while (sVar19 < numPoints);
        break;
      case 0x4299f9:
        numPoints = 3;
        ReadPrimTriStrips(this,numOffsets,perVertexOffset,pMesh,local_90,(size_t)pIVar18,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
        break;
      case 0x429a2c:
        numPoints = 2;
        sVar19 = 0;
        do {
          CopyVertex(this,sVar19,numOffsets,numPoints,perVertexOffset,pMesh,local_90,(size_t)pIVar18
                     ,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
          sVar19 = sVar19 + 1;
        } while (sVar19 < numPoints);
        break;
      case 0x429a74:
        numPoints = 2;
        sVar19 = 0;
        do {
          CopyVertex(this,sVar19,numOffsets,1,perVertexOffset,pMesh,local_90,(size_t)pIVar18,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
          sVar19 = sVar19 + 1;
        } while (sVar19 < numPoints);
        break;
      case 0x429ab6:
        numPoints = (__range2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[(long)pIVar18];
        if (numPoints == 0) {
          sVar19 = 0;
        }
        else {
          uVar10 = 0;
          do {
            CopyVertex(this,(size_t)(&(local_98->_M_t)._M_impl.field_0x0 + uVar10),numOffsets,1,
                       perVertexOffset,pMesh,local_90,0,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
            uVar10 = uVar10 + 1;
            sVar19 = numPoints;
          } while (uVar10 < numPoints);
        }
        local_98 = (DataLibrary *)(&(local_98->_M_t)._M_impl.field_0x0 + sVar19);
      }
      __position._M_current =
           (pMesh->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pMesh->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(local_38,__position,&numPoints);
      }
      else {
        *__position._M_current = numPoints;
        ppuVar1 = &(pMesh->mFaceSize).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      pIVar18 = (IrrXMLReader *)((long)&pIVar18->_vptr_IIrrXMLReader + 1);
    } while (pIVar18 != (IrrXMLReader *)local_88._32_8_);
  }
  TestClosing(this,"p");
  uVar5 = local_88._32_8_;
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  return (size_t)(IrrXMLReader *)uVar5;
}

Assistant:

size_t ColladaParser::ReadPrimitives(Mesh* pMesh, std::vector<InputChannel>& pPerIndexChannels,
    size_t pNumPrimitives, const std::vector<size_t>& pVCount, PrimitiveType pPrimType)
{
    // determine number of indices coming per vertex
    // find the offset index for all per-vertex channels
    size_t numOffsets = 1;
    size_t perVertexOffset = SIZE_MAX; // invalid value
    for (const InputChannel& channel : pPerIndexChannels)
    {
        numOffsets = std::max(numOffsets, channel.mOffset + 1);
        if (channel.mType == IT_Vertex)
            perVertexOffset = channel.mOffset;
    }

    // determine the expected number of indices
    size_t expectedPointCount = 0;
    switch (pPrimType)
    {
    case Prim_Polylist:
    {
        for (size_t i : pVCount)
            expectedPointCount += i;
        break;
    }
    case Prim_Lines:
        expectedPointCount = 2 * pNumPrimitives;
        break;
    case Prim_Triangles:
        expectedPointCount = 3 * pNumPrimitives;
        break;
    default:
        // other primitive types don't state the index count upfront... we need to guess
        break;
    }

    // and read all indices into a temporary array
    std::vector<size_t> indices;
    if (expectedPointCount > 0)
        indices.reserve(expectedPointCount * numOffsets);

    if (pNumPrimitives > 0) // It is possible to not contain any indices
    {
        const char* content = GetTextContent();
        while (*content != 0)
        {
            // read a value.
            // Hack: (thom) Some exporters put negative indices sometimes. We just try to carry on anyways.
            int value = std::max(0, strtol10(content, &content));
            indices.push_back(size_t(value));
            // skip whitespace after it
            SkipSpacesAndLineEnd(&content);
        }
    }

    // complain if the index count doesn't fit
    if (expectedPointCount > 0 && indices.size() != expectedPointCount * numOffsets) {
        if (pPrimType == Prim_Lines) {
            // HACK: We just fix this number since SketchUp 15.3.331 writes the wrong 'count' for 'lines'
            ReportWarning("Expected different index count in <p> element, %zu instead of %zu.", indices.size(), expectedPointCount * numOffsets);
            pNumPrimitives = (indices.size() / numOffsets) / 2;
        }
        else
            ThrowException("Expected different index count in <p> element.");

    }
    else if (expectedPointCount == 0 && (indices.size() % numOffsets) != 0)
        ThrowException("Expected different index count in <p> element.");

    // find the data for all sources
    for (std::vector<InputChannel>::iterator it = pMesh->mPerVertexData.begin(); it != pMesh->mPerVertexData.end(); ++it)
    {
        InputChannel& input = *it;
        if (input.mResolved)
            continue;

        // find accessor
        input.mResolved = &ResolveLibraryReference(mAccessorLibrary, input.mAccessor);
        // resolve accessor's data pointer as well, if necessary
        const Accessor* acc = input.mResolved;
        if (!acc->mData)
            acc->mData = &ResolveLibraryReference(mDataLibrary, acc->mSource);
    }
    // and the same for the per-index channels
    for (std::vector<InputChannel>::iterator it = pPerIndexChannels.begin(); it != pPerIndexChannels.end(); ++it)
    {
        InputChannel& input = *it;
        if (input.mResolved)
            continue;

        // ignore vertex pointer, it doesn't refer to an accessor
        if (input.mType == IT_Vertex)
        {
            // warn if the vertex channel does not refer to the <vertices> element in the same mesh
            if (input.mAccessor != pMesh->mVertexID)
                ThrowException("Unsupported vertex referencing scheme.");
            continue;
        }

        // find accessor
        input.mResolved = &ResolveLibraryReference(mAccessorLibrary, input.mAccessor);
        // resolve accessor's data pointer as well, if necessary
        const Accessor* acc = input.mResolved;
        if (!acc->mData)
            acc->mData = &ResolveLibraryReference(mDataLibrary, acc->mSource);
    }

    // For continued primitives, the given count does not come all in one <p>, but only one primitive per <p>
    size_t numPrimitives = pNumPrimitives;
    if (pPrimType == Prim_TriFans || pPrimType == Prim_Polygon)
        numPrimitives = 1;
    // For continued primitives, the given count is actually the number of <p>'s inside the parent tag
    if (pPrimType == Prim_TriStrips) {
        size_t numberOfVertices = indices.size() / numOffsets;
        numPrimitives = numberOfVertices - 2;
    }
    if (pPrimType == Prim_LineStrip) {
        size_t numberOfVertices = indices.size() / numOffsets;
        numPrimitives = numberOfVertices - 1;
    }

    pMesh->mFaceSize.reserve(numPrimitives);
    pMesh->mFacePosIndices.reserve(indices.size() / numOffsets);

    size_t polylistStartVertex = 0;
    for (size_t currentPrimitive = 0; currentPrimitive < numPrimitives; currentPrimitive++)
    {
        // determine number of points for this primitive
        size_t numPoints = 0;
        switch (pPrimType)
        {
        case Prim_Lines:
            numPoints = 2;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_LineStrip:
            numPoints = 2;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_Triangles:
            numPoints = 3;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_TriStrips:
            numPoints = 3;
            ReadPrimTriStrips(numOffsets, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_Polylist:
            numPoints = pVCount[currentPrimitive];
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(polylistStartVertex + currentVertex, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, 0, indices);
            polylistStartVertex += numPoints;
            break;
        case Prim_TriFans:
        case Prim_Polygon:
            numPoints = indices.size() / numOffsets;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        default:
            // LineStrip is not supported due to expected index unmangling
            ThrowException("Unsupported primitive type.");
            break;
        }

        // store the face size to later reconstruct the face from
        pMesh->mFaceSize.push_back(numPoints);
    }

    // if I ever get my hands on that guy who invented this steaming pile of indirection...
    TestClosing("p");
    return numPrimitives;
}